

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualbalance.cpp
# Opt level: O1

void __thiscall QualBalance::writeBalance(QualBalance *this,ostream *msgLog)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(msgLog,"\n  Water Quality Mass Balance",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>(msgLog,"\n  --------------------------",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>(msgLog,"\n  Initial Storage           ",0x1d);
  std::ostream::_M_insert<double>(this->initMass / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(msgLog,"\n  Mass Inflow               ",0x1d);
  std::ostream::_M_insert<double>(this->inflowMass / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(msgLog,"\n  Mass Outflow              ",0x1d);
  std::ostream::_M_insert<double>(this->outflowMass / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(msgLog,"\n  Mass Reacted              ",0x1d);
  std::ostream::_M_insert<double>(this->reactedMass / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(msgLog,"\n  Final Storage             ",0x1d);
  std::ostream::_M_insert<double>(this->storedMass / 1000000.0);
  dVar3 = this->initMass + this->inflowMass;
  dVar2 = this->outflowMass + this->reactedMass + this->storedMass;
  dVar4 = 0.0;
  if (dVar3 <= 0.0) {
    if (0.0 < dVar2) {
      dVar4 = ((dVar3 - dVar2) * 100.0) / dVar2;
    }
  }
  else {
    dVar4 = ((dVar3 - dVar2) * 100.0) / dVar3;
  }
  std::__ostream_insert<char,std::char_traits<char>>(msgLog,"\n  Percent Imbalance         ",0x1d);
  poVar1 = std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void QualBalance::writeBalance(ostream& msgLog)
{
    msgLog <<   "\n  Water Quality Mass Balance"
           <<   "\n  --------------------------";
    msgLog <<   "\n  Initial Storage           " << initMass / 1.e6;
    msgLog <<   "\n  Mass Inflow               " << inflowMass / 1.e6;
    msgLog <<   "\n  Mass Outflow              " << outflowMass / 1.e6;
    msgLog <<   "\n  Mass Reacted              " << reactedMass / 1.e6;
    msgLog <<   "\n  Final Storage             " << storedMass / 1.e6;

    double massIn = initMass + inflowMass;
    double massOut = outflowMass + reactedMass + storedMass;
    double pctDiff = (massIn - massOut);
    if ( massIn > 0.0 ) pctDiff = 100.0 * pctDiff / massIn;
    else if (massOut > 0.0 ) pctDiff = 100.0 * pctDiff / massOut;
    else pctDiff = 0.0;
    msgLog <<   "\n  Percent Imbalance         " << pctDiff << "\n";
}